

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1501.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  timeval tVar9;
  timeval tVar10;
  undefined8 uStack_1d0;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  still_running = 0;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                  ,0x2d,iVar1,uVar2);
    goto LAB_001023b2;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                  ,0x2f);
    iVar1 = 0x7c;
    goto LAB_0010239d;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1d0 = 0x32;
      goto LAB_0010238c;
    }
    lVar4 = curl_multi_init();
    if (lVar4 != 0) {
      iVar1 = curl_multi_add_handle(lVar4,lVar3);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_multi_perform(lVar4,&still_running);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          if (still_running < 0) {
            pcVar7 = 
            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
            ;
            uStack_1d0 = 0x38;
LAB_0010266a:
            curl_mfprintf(_stderr,pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                          ,uStack_1d0);
            iVar1 = 0x7a;
          }
          else {
            tVar9 = tutil_tvnow();
            lVar5 = tutil_tvdiff(tVar9,tv_test_start);
            if (lVar5 < 0x7531) {
              if (still_running == 0) {
                iVar1 = 0;
              }
              else {
                do {
                  timeout.tv_sec = 0;
                  maxfd = -99;
                  timeout.tv_usec = 100000;
                  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
                    fdread.__fds_bits[lVar5] = 0;
                  }
                  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
                    fdwrite.__fds_bits[lVar5] = 0;
                  }
                  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
                    fdexcep.__fds_bits[lVar5] = 0;
                  }
                  iVar1 = curl_multi_fdset(lVar4,&fdread,&fdwrite,&fdexcep,&maxfd);
                  uVar8 = _stderr;
                  if (iVar1 != 0) {
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                    uStack_1d0 = 0x4d;
                    goto LAB_0010238c;
                  }
                  if (maxfd < -1) {
                    pcVar7 = 
                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                    uStack_1d0 = 0x4d;
                    goto LAB_0010266a;
                  }
                  iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
                  if (iVar1 == -1) {
                    piVar6 = __errno_location();
                    uVar8 = _stderr;
                    iVar1 = *piVar6;
                    pcVar7 = strerror(iVar1);
                    curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                  ,0x51,iVar1,pcVar7);
                    iVar1 = 0x79;
                    break;
                  }
                  tVar9 = tutil_tvnow();
                  lVar5 = tutil_tvdiff(tVar9,tv_test_start);
                  if (30000 < lVar5) {
                    uStack_1d0 = 0x53;
                    goto LAB_00102693;
                  }
                  curl_mfprintf(_stderr,"ping\n");
                  tVar9 = tutil_tvnow();
                  iVar1 = curl_multi_perform(lVar4,&still_running);
                  uVar8 = _stderr;
                  if (iVar1 != 0) {
                    uVar2 = curl_multi_strerror(iVar1);
                    curl_mfprintf(uVar8,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                  ,0x58,iVar1,uVar2);
                    break;
                  }
                  if (still_running < 0) {
                    pcVar7 = 
                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                    ;
                    uStack_1d0 = 0x58;
                    goto LAB_0010266a;
                  }
                  tVar10 = tutil_tvnow();
                  lVar5 = tutil_tvdiff(tVar10,tv_test_start);
                  if (30000 < lVar5) {
                    uStack_1d0 = 0x5a;
                    goto LAB_00102693;
                  }
                  tVar10 = tutil_tvnow();
                  lVar5 = tutil_tvdiff(tVar10,tVar9);
                  curl_mfprintf(_stderr,"pong = %ld\n",lVar5);
                  if (500 < lVar5) {
                    iVar1 = 100;
                    break;
                  }
                  iVar1 = 0;
                } while (still_running != 0);
              }
            }
            else {
              uStack_1d0 = 0x3a;
LAB_00102693:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                            ,uStack_1d0);
              iVar1 = 0x7d;
            }
          }
          goto LAB_0010239d;
        }
        uVar2 = curl_multi_strerror(iVar1);
        pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uStack_1d0 = 0x38;
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1d0 = 0x36;
      }
      goto LAB_0010238c;
    }
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                  ,0x34);
    iVar1 = 0x7b;
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar4 = 0;
    uStack_1d0 = 0x31;
LAB_0010238c:
    curl_mfprintf(uVar8,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                  ,uStack_1d0,iVar1,uVar2);
  }
LAB_0010239d:
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_001023b2:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLM *mhandle = NULL;
  int res = 0;
  int still_running = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(handle);

  easy_setopt(handle, CURLOPT_URL, URL);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);

  multi_init(mhandle);

  multi_add_handle(mhandle, handle);

  multi_perform(mhandle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;
    struct timeval before;
    struct timeval after;
    long e;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(mhandle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    fprintf(stderr, "ping\n");
    before = tutil_tvnow();

    multi_perform(mhandle, &still_running);

    abort_on_test_timeout();

    after = tutil_tvnow();
    e = tutil_tvdiff(after, before);
    fprintf(stderr, "pong = %ld\n", e);

    if(e > MAX_BLOCKED_TIME_MS) {
      res = 100;
      break;
    }
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(mhandle);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}